

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManager.cpp
# Opt level: O1

void __thiscall luna::ModuleManager::LoadModule(ModuleManager *this,string *module_name)

{
  State *this_00;
  Value *pVVar1;
  String *module;
  OpenFileFail *this_01;
  InStream is;
  Value value;
  Value key;
  Lexer lexer;
  InStream local_d0;
  _Any_data local_c8;
  code *local_b8;
  code *pcStack_b0;
  anon_union_8_9_8deb4486_for_Value_0 local_a8;
  undefined8 uStack_a0;
  anon_union_8_9_8deb4486_for_Value_0 local_90;
  undefined4 local_88;
  Lexer local_80;
  
  io::text::InStream::InStream(&local_d0,module_name);
  if (local_d0.stream_ != (FILE *)0x0) {
    this_00 = this->state_;
    module = State::GetString(this_00,module_name);
    local_c8._8_8_ = 0;
    pcStack_b0 = std::
                 _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/ModuleManager.cpp:38:21)>
                 ::_M_invoke;
    local_b8 = std::
               _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/ModuleManager.cpp:38:21)>
               ::_M_manager;
    local_c8._M_unused._M_object = &local_d0;
    Lexer::Lexer(&local_80,this_00,module,(CharInStream *)&local_c8);
    if (local_b8 != (code *)0x0) {
      (*local_b8)(&local_c8,&local_c8,__destroy_functor);
    }
    Load(this,&local_80);
    local_90.str_ = State::GetString(this->state_,module_name);
    local_88 = 4;
    pVVar1 = (this->state_->stack_).top_;
    local_a8 = pVVar1[-1].field_0;
    uStack_a0 = *(undefined8 *)&pVVar1[-1].type_;
    Table::SetValue(this->modules_,(Value *)&local_90,(Value *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80.token_buffer_._M_dataplus._M_p != &local_80.token_buffer_.field_2) {
      operator_delete(local_80.token_buffer_._M_dataplus._M_p);
    }
    if (local_80.in_stream_.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_80.in_stream_.super__Function_base._M_manager)
                ((_Any_data *)&local_80.in_stream_,(_Any_data *)&local_80.in_stream_,
                 __destroy_functor);
    }
    io::text::InStream::~InStream(&local_d0);
    return;
  }
  this_01 = (OpenFileFail *)__cxa_allocate_exception(0x20);
  OpenFileFail::OpenFileFail(this_01,module_name);
  __cxa_throw(this_01,&OpenFileFail::typeinfo,Exception::~Exception);
}

Assistant:

void ModuleManager::LoadModule(const std::string &module_name)
    {
        io::text::InStream is(module_name);
        if (!is.IsOpen())
            throw OpenFileFail(module_name);

        Lexer lexer(state_, state_->GetString(module_name),
                    [&is] () { return is.GetChar(); });
        Load(lexer);

        // Add to modules' table
        Value key(state_->GetString(module_name));
        Value value = *(state_->stack_.top_ - 1);
        modules_->SetValue(key, value);
    }